

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O0

void av1_nn_softmax(float *input,float *output,int n)

{
  int in_EDX;
  long in_RSI;
  float *in_RDI;
  float fVar1;
  int i_2;
  float normalized_input;
  int i_1;
  float sum_out;
  int i;
  float max_input;
  float local_34;
  float local_30;
  int local_2c;
  int local_24;
  float local_20;
  int local_1c;
  float local_18;
  
  local_18 = *in_RDI;
  for (local_1c = 1; local_1c < in_EDX; local_1c = local_1c + 1) {
    if (local_18 < in_RDI[local_1c] || local_18 == in_RDI[local_1c]) {
      local_30 = in_RDI[local_1c];
    }
    else {
      local_30 = local_18;
    }
    local_18 = local_30;
  }
  local_20 = 0.0;
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    if (in_RDI[local_24] - local_18 <= -10.0) {
      local_34 = -10.0;
    }
    else {
      local_34 = in_RDI[local_24] - local_18;
    }
    fVar1 = expf(local_34);
    *(float *)(in_RSI + (long)local_24 * 4) = fVar1;
    local_20 = *(float *)(in_RSI + (long)local_24 * 4) + local_20;
  }
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    *(float *)(in_RSI + (long)local_2c * 4) = *(float *)(in_RSI + (long)local_2c * 4) / local_20;
  }
  return;
}

Assistant:

void av1_nn_softmax(const float *input, float *output, int n) {
  // Softmax function is invariant to adding the same constant
  // to all input values, so we subtract the maximum input to avoid
  // possible overflow.
  float max_input = input[0];
  for (int i = 1; i < n; i++) max_input = AOMMAX(max_input, input[i]);
  float sum_out = 0.0f;
  for (int i = 0; i < n; i++) {
    // Clamp to range [-10.0, 0.0] to prevent FE_UNDERFLOW errors.
    const float normalized_input = AOMMAX(input[i] - max_input, -10.0f);
    output[i] = expf(normalized_input);
    sum_out += output[i];
  }
  for (int i = 0; i < n; i++) output[i] /= sum_out;
}